

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_ThrowingTransform_Test::TestBody(TApp_ThrowingTransform_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Option *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  AssertionResult gtest_ar;
  ValidationError *e;
  Message local_130 [2];
  ValidationError *anon_var_0;
  char *pcStack_118;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  iterator local_e0;
  size_type local_d8;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_c0;
  anon_class_1_0_00000001 local_b9;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  local_b8;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  Option *local_38;
  Option *m;
  string val;
  TApp_ThrowingTransform_Test *this_local;
  
  val.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&m);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"-m,--mess",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"",&local_91);
  this_00 = CLI::App::
            add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                      (&(this->super_TApp).app,&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
                       &local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_38 = this_00;
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<TApp_ThrowingTransform_Test::TestBody()::__0,void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)&local_b8,&local_b9);
  CLI::Option::transform(this_00,&local_b8);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function(&local_b8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
  }
  else {
    testing::Message::Message(&local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x533,"Expected: run() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message(&local_c8);
  }
  CLI::App::reset(&(this->super_TApp).app);
  gtest_msg.value._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"-mone",(allocator *)((long)&gtest_msg.value + 7));
  gtest_msg.value._6_1_ = 0;
  local_e0 = &local_100;
  local_d8 = 1;
  __l._M_len = 1;
  __l._M_array = local_e0;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
  do {
    local_1e8 = local_1e8 + -1;
    std::__cxx11::string::~string((string *)local_1e8);
  } while (local_1e8 != &local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_msg.value + 7));
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffee8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffee8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TApp::run(&this->super_TApp);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      CLI::App::reset(&(this->super_TApp).app);
      TApp::run(&this->super_TApp);
      local_c0 = 0;
      goto LAB_00151fa2;
    }
    pcStack_118 = 
    "Expected: run() throws an exception of type CLI::ValidationError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_130);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&e,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
             ,0x538,pcStack_118);
  testing::internal::AssertHelper::operator=((AssertHelper *)&e,local_130);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&e);
  testing::Message::~Message(local_130);
  local_c0 = 1;
LAB_00151fa2:
  std::__cxx11::string::~string((string *)&m);
  return;
}

Assistant:

TEST_F(TApp, ThrowingTransform) {
    std::string val;
    auto m = app.add_option("-m,--mess", val);
    m->transform([](std::string) -> std::string { throw CLI::ValidationError("My Message"); });

    EXPECT_NO_THROW(run());
    app.reset();

    args = {"-mone"};

    ASSERT_THROW(run(), CLI::ValidationError);

    app.reset();

    try {
        run();
    } catch(const CLI::ValidationError &e) {
        EXPECT_EQ(e.what(), std::string("--mess: My Message"));
    }
}